

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O3

void * utm_allocN(UToolMemory *mem,int32_t n)

{
  int iVar1;
  void *pvVar2;
  int capacity;
  
  iVar1 = mem->idx;
  capacity = iVar1 + n;
  utm_hasCapacity(mem,capacity);
  mem->idx = capacity;
  pvVar2 = memset((void *)((long)(iVar1 * mem->size) + (long)mem->array),0,(long)(mem->size * n));
  return pvVar2;
}

Assistant:

U_CAPI void * U_EXPORT2
utm_allocN(UToolMemory *mem, int32_t n) {
    char *p=NULL;
    int32_t oldIndex=mem->idx;
    int32_t newIndex=oldIndex+n;
    if(utm_hasCapacity(mem, newIndex)) {
        p=(char *)mem->array+oldIndex*mem->size;
        mem->idx=newIndex;
        uprv_memset(p, 0, n*mem->size);
    }
    return p;
}